

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O0

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::New(CordRepBtree *front,CordRepBtree *back)

{
  int iVar1;
  int iVar2;
  CordRepBtree *this;
  CordRepBtree *tree;
  CordRepBtree *back_local;
  CordRepBtree *front_local;
  
  iVar1 = height(front);
  iVar2 = height(back);
  if (iVar1 == iVar2) {
    this = (CordRepBtree *)operator_new(0x40);
    CordRepBtree(this);
    (this->super_CordRep).length = (front->super_CordRep).length + (back->super_CordRep).length;
    iVar1 = height(front);
    InitInstance(this,iVar1 + 1,0,2);
    this->edges_[0] = &front->super_CordRep;
    this->edges_[1] = &back->super_CordRep;
    return this;
  }
  __assert_fail("front->height() == back->height()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x294,
                "static CordRepBtree *absl::cord_internal::CordRepBtree::New(CordRepBtree *, CordRepBtree *)"
               );
}

Assistant:

inline CordRepBtree* CordRepBtree::New(CordRepBtree* front,
                                       CordRepBtree* back) {
  assert(front->height() == back->height());
  CordRepBtree* tree = new CordRepBtree;
  tree->length = front->length + back->length;
  tree->InitInstance(front->height() + 1, /*begin=*/0, /*end=*/2);
  tree->edges_[0] = front;
  tree->edges_[1] = back;
  return tree;
}